

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int SSL_set_tlsext_host_name(SSL *ssl,char *name)

{
  bool bVar1;
  size_t sVar2;
  char *__p;
  size_t len;
  char *name_local;
  SSL *ssl_local;
  
  std::unique_ptr<char,_bssl::internal::Deleter>::reset(&ssl->hostname,(pointer)0x0);
  if (name == (char *)0x0) {
    ssl_local._4_4_ = 1;
  }
  else {
    sVar2 = strlen(name);
    if ((sVar2 == 0) || (0xff < sVar2)) {
      ERR_put_error(0x10,0,0xd5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                    ,0x841);
      ssl_local._4_4_ = 0;
    }
    else {
      __p = OPENSSL_strdup(name);
      std::unique_ptr<char,_bssl::internal::Deleter>::reset(&ssl->hostname,__p);
      bVar1 = std::operator==(&ssl->hostname,(nullptr_t)0x0);
      if (bVar1) {
        ssl_local._4_4_ = 0;
      }
      else {
        ssl_local._4_4_ = 1;
      }
    }
  }
  return ssl_local._4_4_;
}

Assistant:

int SSL_set_tlsext_host_name(SSL *ssl, const char *name) {
  ssl->hostname.reset();
  if (name == nullptr) {
    return 1;
  }

  size_t len = strlen(name);
  if (len == 0 || len > TLSEXT_MAXLEN_host_name) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_SSL3_EXT_INVALID_SERVERNAME);
    return 0;
  }
  ssl->hostname.reset(OPENSSL_strdup(name));
  if (ssl->hostname == nullptr) {
    return 0;
  }
  return 1;
}